

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_io.cc
# Opt level: O0

void __thiscall comp_io_buf::reset_file(comp_io_buf *this,int f)

{
  char *pcVar1;
  reference ppgVar2;
  char **ppcVar3;
  int in_ESI;
  long in_RDI;
  gzFile fil;
  
  ppgVar2 = std::vector<gzFile_s_*,_std::allocator<gzFile_s_*>_>::operator[]
                      ((vector<gzFile_s_*,_std::allocator<gzFile_s_*>_> *)(in_RDI + 0xa8),
                       (long)in_ESI);
  gzseek64(*ppgVar2,0,0);
  ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
  pcVar1 = *ppcVar3;
  ppcVar3 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
  *ppcVar3 = pcVar1;
  ppcVar3 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
  *(char **)(in_RDI + 0x60) = *ppcVar3;
  return;
}

Assistant:

void comp_io_buf::reset_file(int f)
{
  gzFile fil = gz_files[f];
  gzseek(fil, 0, SEEK_SET);
  space.end() = space.begin();
  head = space.begin();
}